

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O3

int s3phseg_write(char *fn,acmod_set_t *acmod_set,s3phseg_t *phseg)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  
  __stream = fopen(fn,"w");
  if (__stream == (FILE *)0x0) {
    iVar4 = -1;
  }
  else {
    fprintf(__stream,"\t%5s %5s %9s %s\n","SFrm","EFrm","SegAScr","Phone");
    for (; phseg != (s3phseg_t *)0x0; phseg = phseg->next) {
      uVar1 = phseg->sf;
      uVar2 = phseg->ef;
      uVar3 = phseg->score;
      pcVar5 = acmod_set_id2name(acmod_set,phseg->phone);
      fprintf(__stream,"\t%5d %5d %9d %s\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,pcVar5);
    }
    fclose(__stream);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
s3phseg_write(const char *fn,
	      acmod_set_t *acmod_set,
	      s3phseg_t *phseg)
{
	FILE *fp;

	if ((fp = fopen(fn, "w")) == NULL)
		return S3_ERROR;

	fprintf (fp, "\t%5s %5s %9s %s\n",
		 "SFrm", "EFrm", "SegAScr", "Phone");
	for (; phseg; phseg = phseg->next) {
		fprintf(fp, "\t%5d %5d %9d %s\n",
			phseg->sf, phseg->ef, phseg->score,
			acmod_set_id2name(acmod_set, phseg->phone));
	}
	fclose (fp);

	return S3_SUCCESS;
}